

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskROM.cpp
# Opt level: O0

ssize_t __thiscall MSX::DiskROM::read(DiskROM *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  bool bVar2;
  byte bVar3;
  ssize_t sVar4;
  byte *pbVar5;
  byte bVar6;
  uint16_t address_local;
  DiskROM *this_local;
  
  uVar1 = (ushort)__fd;
  if ((uVar1 < 0x7ff8) || (0x7ffb < uVar1)) {
    if (uVar1 == 0x7fff) {
      bVar2 = WD::WD1770::get_data_request_line(&this->super_WD1770);
      bVar3 = 0x80;
      if (bVar2) {
        bVar3 = 0;
      }
      bVar2 = WD::WD1770::get_interrupt_request_line(&this->super_WD1770);
      bVar6 = 0x40;
      if (bVar2) {
        bVar6 = 0;
      }
      this_local._7_1_ = bVar3 | bVar6;
      sVar4 = 0;
    }
    else {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (this->rom_,(long)(int)(__fd & 0x3fff));
      this_local._7_1_ = *pbVar5;
      sVar4 = CONCAT71((int7)((ulong)pbVar5 >> 8),this_local._7_1_);
    }
  }
  else {
    sVar4 = WD::WD1770::read(&this->super_WD1770,__fd & 0xffff,__buf,__nbytes);
    this_local._7_1_ = (byte)sVar4;
  }
  return CONCAT71((int7)((ulong)sVar4 >> 8),this_local._7_1_);
}

Assistant:

uint8_t DiskROM::read(uint16_t address) {
	if(address >= 0x7ff8 && address < 0x7ffc) {
		return WD::WD1770::read(address);
	}
	if(address == 0x7fff) {
		return (get_data_request_line() ? 0x00 : 0x80) | (get_interrupt_request_line() ? 0x00 : 0x40);
	}
	return rom_[address & 0x3fff];
}